

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void runMusashi(Setup *s,Result *r)

{
  u16 uVar1;
  uint uVar2;
  int iVar3;
  clock_t cVar4;
  clock_t cVar5;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  clock_t elapsed_1;
  clock_t elapsed;
  anon_enum_32 type;
  Result *r_local;
  Setup *s_local;
  
  uVar2 = m68k_get_reg((void *)0x0,M68K_REG_PC);
  r->oldpc = uVar2;
  uVar1 = get16(musashiMem,r->oldpc);
  r->opcode = uVar1;
  r->elapsed[1] = 0;
  r->elapsed[0] = 0;
  if (cpuModel == M68000) {
    local_34 = 1;
  }
  else {
    if (cpuModel == M68010) {
      local_38 = 2;
    }
    else {
      if (cpuModel == M68EC020) {
        local_3c = 3;
      }
      else {
        if (cpuModel == M68020) {
          local_40 = 4;
        }
        else {
          if (cpuModel == M68EC030) {
            local_44 = 5;
          }
          else {
            if (cpuModel == M68030) {
              local_48 = 6;
            }
            else {
              if (cpuModel == M68EC040) {
                local_4c = 7;
              }
              else {
                local_4c = 9;
                if (cpuModel == M68LC040) {
                  local_4c = 8;
                }
              }
              local_48 = local_4c;
            }
            local_44 = local_48;
          }
          local_40 = local_44;
        }
        local_3c = local_40;
      }
      local_38 = local_3c;
    }
    local_34 = local_38;
  }
  cVar4 = clock();
  uVar2 = m68k_disassemble(r->dasmMusashi,s->pc,local_34);
  r->dasmCntMusashi = uVar2;
  cVar5 = clock();
  r->elapsed[1] = cVar5 - cVar4;
  if (r->opcode < 0xf000) {
    cVar4 = clock();
    iVar3 = m68k_execute(1);
    r->cycles = iVar3;
    cVar5 = clock();
    r->elapsed[0] = cVar5 - cVar4;
    recordMusashiRegisters(r);
  }
  return;
}

Assistant:

void runMusashi(Setup &s, Result &r)
{
    r.oldpc = m68k_get_reg(NULL, M68K_REG_PC);
    r.opcode = get16(musashiMem, r.oldpc);
    r.elapsed[0] = r.elapsed[1] = 0;

    // Run the Musashi disassembler
    auto type =
    cpuModel == Model::M68000   ? M68K_CPU_TYPE_68000 :
    cpuModel == Model::M68010   ? M68K_CPU_TYPE_68010 :
    cpuModel == Model::M68EC020 ? M68K_CPU_TYPE_68EC020 :
    cpuModel == Model::M68020   ? M68K_CPU_TYPE_68020 :
    cpuModel == Model::M68EC030 ? M68K_CPU_TYPE_68EC030 :
    cpuModel == Model::M68030   ? M68K_CPU_TYPE_68030 :
    cpuModel == Model::M68EC040 ? M68K_CPU_TYPE_68EC040 :
    cpuModel == Model::M68LC040 ? M68K_CPU_TYPE_68LC040 : M68K_CPU_TYPE_68040;

    clock_t elapsed = clock();
    r.dasmCntMusashi = m68k_disassemble(r.dasmMusashi, s.pc, type);
    r.elapsed[1] = clock() - elapsed;

    if (VERBOSE) {
        printf("$%04x ($%04x): %s (Musashi)\n", r.oldpc, r.opcode, r.dasmMusashi);
    }

    // Run the Musashi CPU
    if (doExec(r.opcode)) {

        clock_t elapsed = clock();
        r.cycles = m68k_execute(1);
        r.elapsed[0] = clock() - elapsed;

        recordMusashiRegisters(r);
    }
}